

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O2

void __thiscall
CLI::detail::ExistingPathValidator::ExistingPathValidator(ExistingPathValidator *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"PATH(existing)",&local_31)
  ;
  Validator::Validator(&this->super_Validator,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,(anon_class_1_0_00000001 *)&local_31);
  return;
}

Assistant:

ExistingPathValidator() : Validator("PATH(existing)") {
        func_ = [](std::string &filename) {
            auto path_result = check_path(filename.c_str());
            if(path_result == path_type::nonexistant) {
                return "Path does not exist: " + filename;
            }
            return std::string();
        };
    }